

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O3

bool __thiscall AllDiffDomain<0>::prune(AllDiffDomain<0> *this,int node,int i)

{
  int iVar1;
  bool *pbVar2;
  Node *pNVar3;
  IntVar *pIVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  Clause *pCVar13;
  ulong uVar14;
  uint uVar15;
  Clause *c;
  uint local_70;
  Clause *local_38;
  
  if (!so.lazy) {
    pCVar13 = (Clause *)0x0;
    goto LAB_00158d4e;
  }
  uVar6 = this->val_nodes[i].scc;
  uVar8 = (ulong)(int)uVar6;
  if ((long)uVar8 < 0) {
    iVar5 = 0;
    uVar15 = 0x7fffffff;
    local_70 = 0x80000000;
    iVar10 = 0;
LAB_00158b8b:
    iVar5 = ((local_70 - (iVar10 + uVar15)) + 3) * iVar5;
    local_38 = (Clause *)malloc((long)iVar5 * 4 + 0xc);
    *(uint *)local_38 = iVar5 * 0x100 + 0x102;
    vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
    pCVar13 = local_38;
    if (-1 < (int)uVar6) {
      iVar5 = 1;
      do {
        uVar14 = uVar8 & 0xffffffff;
        if ((int)uVar8 < this->sz) {
          pIVar4 = this->x[uVar14].var;
          uVar6 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0xd])
                            (pIVar4,(long)(int)uVar15,2);
          if ((int)(*(uint *)pCVar13 >> 8) <= iVar5) goto LAB_00158d7d;
          iVar10 = iVar5 + 1;
          pCVar13->data[iVar5].x = uVar6 ^ 1;
          lVar9 = (long)(int)(uVar15 + 1);
          iVar5 = ~uVar15 + local_70;
          if ((int)(uVar15 + 1) < (int)local_70) {
            do {
              if (this->scoreboard[lVar9] == false) {
                pIVar4 = this->x[uVar14].var;
                uVar6 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0xd])(pIVar4,lVar9,0);
                if ((int)(*(uint *)pCVar13 >> 8) <= iVar10) goto LAB_00158d7d;
                lVar7 = (long)iVar10;
                iVar10 = iVar10 + 1;
                pCVar13->data[lVar7].x = uVar6 ^ 1;
              }
              lVar9 = lVar9 + 1;
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
          }
          pIVar4 = this->x[uVar14].var;
          uVar6 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0xd])
                            (pIVar4,(long)(int)local_70,3);
          if ((int)(*(uint *)pCVar13 >> 8) <= iVar10) goto LAB_00158d7d;
          iVar5 = iVar10 + 1;
          pCVar13->data[iVar10].x = uVar6 ^ 1;
        }
        uVar6 = this->var_nodes[uVar14].next;
        uVar8 = (ulong)uVar6;
      } while (-1 < (int)uVar6);
    }
  }
  else {
    iVar1 = this->sz;
    pbVar2 = this->scoreboard;
    pNVar3 = this->var_nodes;
    local_70 = 0x80000000;
    uVar15 = 0x7fffffff;
    iVar5 = 0;
    iVar10 = 0;
    uVar11 = uVar6;
    do {
      uVar12 = uVar11 - iVar1;
      if ((int)uVar11 < iVar1) {
        iVar5 = iVar5 + 1;
      }
      else {
        iVar10 = iVar10 + 1;
        if ((int)uVar12 < (int)uVar15) {
          uVar15 = uVar12;
        }
        if ((int)local_70 <= (int)uVar12) {
          local_70 = uVar12;
        }
        pbVar2[(int)uVar12] = true;
      }
      uVar11 = pNVar3[uVar11].next;
    } while (-1 < (int)uVar11);
    if (iVar10 != 1) goto LAB_00158b8b;
    local_38 = (Clause *)malloc(0x10);
    *(uint *)local_38 = 0x202;
    vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
    pCVar13 = local_38;
    if (this->sz <= (int)uVar6) {
      uVar6 = this->var_nodes[uVar8].next;
    }
    uVar6 = (*((this->x[(int)uVar6].var)->super_Var).super_Branching._vptr_Branching[10])();
    if (*(uint *)pCVar13 < 0x200) {
LAB_00158d7d:
      abort();
    }
    *(uint *)(pCVar13 + 1) = uVar6;
  }
  memset(this->scoreboard + (int)uVar15,0,(long)(int)((local_70 - uVar15) + 1));
LAB_00158d4e:
  pIVar4 = this->x[node].var;
  iVar5 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0x11])(pIVar4,(long)i,pCVar13,1);
  return SUB41(iVar5,0);
}

Assistant:

bool prune(int node, int i) {
		// fprintf(stderr, "prune var %d val %d\n", node, i);
		Clause* r = nullptr;
		if (so.lazy) {
			int vars = 0;
			int vals = 0;
			int min_val = INT_MAX;
			int max_val = INT_MIN;
			const int scc = val_nodes[i].scc;
			for (int j = scc; j >= 0; j = var_nodes[j].next) {
				if (j < sz) {
					++vars;
				} else {
					++vals;
					min_val = std::min(min_val, j - sz);
					max_val = std::max(max_val, j - sz);
					scoreboard[j - sz] = true;
				}
			}
			assert(vars == vals);
			if (vals == 1) {
				r = Reason_new(2);
				(*r)[1] = x[(scc < sz) ? scc : var_nodes[scc].next].getValLit();
			} else {
				r = Reason_new(1 + vars * (2 + (max_val + 1 - min_val) - vals));
				int k = 1;
				for (int j = scc; j >= 0; j = var_nodes[j].next) {
					if (j < sz) {
						(*r)[k++] = ~x[j].getLit(min_val, LR_GE);
						for (int v = min_val + 1; v < max_val; ++v) {
							if (!scoreboard[v]) {
								(*r)[k++] = ~x[j].getLit(v, LR_NE);
							}
						}
						(*r)[k++] = ~x[j].getLit(max_val, LR_LE);
					}
				}
				assert(k == 1 + vars * (2 + (max_val + 1 - min_val) - vals));
			}
			memset(scoreboard + min_val, 0, max_val + 1 - min_val);
		}
		return x[node].remVal(i, r);
	}